

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
baseObject::drawObject
          (baseObject *this,ostream *os,uint counter,size *_canvasOffset,size *_canvasSize)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  objectType oVar6;
  bool bVar7;
  ostream *poVar8;
  double dVar9;
  const_reference pvVar10;
  size_type sVar11;
  reference pbVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  point pVar17;
  double local_228;
  double local_218;
  double local_208;
  double local_1f8;
  int canvasHeight;
  int canvasWidth;
  int offsetY;
  int offsetX;
  _point local_178;
  undefined1 local_168 [8];
  point RT;
  _point local_148;
  undefined1 local_138 [8];
  point LB;
  double maxY;
  double minY;
  double maxX;
  double minX;
  undefined1 local_f8 [8];
  point canvasPoint_2;
  double local_d8;
  point canvasPoint_1;
  size_t i_2;
  bezierPoint *it;
  const_iterator __end3;
  const_iterator __begin3;
  vector<bezierPoint,_std::allocator<bezierPoint>_> *__range3;
  undefined1 local_90 [8];
  point canvasPointStart;
  size_t index_1;
  size_t i_1;
  size_t index;
  undefined1 local_58 [8];
  point canvasPoint;
  size_t i;
  int canvasSizePPTXHeight;
  int canvasSizePPTXWidth;
  int canvasOffsetPPTXHeight;
  int canvasOffsetPPTXWidth;
  size *_canvasSize_local;
  size *_canvasOffset_local;
  uint counter_local;
  ostream *os_local;
  baseObject *this_local;
  
  iVar13 = (int)(_canvasOffset->width * 360000.0);
  iVar14 = (int)(_canvasOffset->height * 360000.0);
  iVar15 = (int)(_canvasSize->width * 360000.0);
  iVar16 = (int)(_canvasSize->height * 360000.0);
  oVar6 = this->type;
  if (oVar6 != OBJECT_CURVES) {
    if (oVar6 == OBJECT_STRAIGHTLINE) {
      pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,0);
      dVar1 = pvVar10->x;
      pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,1);
      if (pvVar10->x <= dVar1) {
        pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,1);
        local_1f8 = pvVar10->x;
      }
      else {
        pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,0);
        local_1f8 = pvVar10->x;
      }
      pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,1);
      dVar1 = pvVar10->x;
      pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,0);
      if (pvVar10->x <= dVar1) {
        pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,1);
        local_208 = pvVar10->x;
      }
      else {
        pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,0);
        local_208 = pvVar10->x;
      }
      pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,0);
      dVar1 = pvVar10->y;
      pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,1);
      if (pvVar10->y <= dVar1) {
        pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,1);
        local_218 = pvVar10->y;
      }
      else {
        pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,0);
        local_218 = pvVar10->y;
      }
      pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,1);
      dVar1 = pvVar10->y;
      pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,0);
      if (pvVar10->y <= dVar1) {
        pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,1);
        local_228 = pvVar10->y;
      }
      else {
        pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,0);
        local_228 = pvVar10->y;
      }
      LB.y = local_228;
      _point::_point(&local_148,local_1f8,local_218);
      _size::_size((_size *)&RT.y,(double)iVar15,(double)iVar16);
      _local_138 = convertToCanvas(this,&local_148,(size *)&RT.y);
      _point::_point(&local_178,local_208,LB.y);
      _size::_size((_size *)&offsetY,(double)iVar15,(double)iVar16);
      _local_168 = convertToCanvas(this,&local_178,(size *)&offsetY);
      iVar15 = (int)(double)local_138;
      iVar16 = (int)RT.x;
      dVar1 = (this->rangeX).max;
      dVar9 = (this->rangeX).min;
      dVar2 = _canvasSize->width;
      local_218 = LB.y - local_218;
      dVar3 = (this->rangeY).max;
      dVar4 = (this->rangeY).min;
      dVar5 = _canvasSize->height;
      poVar8 = std::operator<<(os,"<p:cxnSp><p:nvCxnSpPr><p:cNvPr id=\"");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,counter);
      poVar8 = std::operator<<(poVar8,"\" name=\"LineArrow");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,counter);
      std::operator<<(poVar8,
                      "\"><a:extLst><a:ext uri=\"{FF2B5EF4-FFF2-40B4-BE49-F238E27FC236}\"><a16:creationId xmlns:a16=\"http://schemas.microsoft.com/office/drawing/2014/main\" id=\"{B606E735-2B9E-47D5-A972-698E782DD359}\"/></a:ext></a:extLst></p:cNvPr><p:cNvCxnSpPr/><p:nvPr/></p:nvCxnSpPr>"
                     );
      poVar8 = std::operator<<(os,"<p:spPr><a:xfrm flipV=\"1\"><a:off x=\"");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar15 + iVar13);
      poVar8 = std::operator<<(poVar8,"\" y=\"");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar16 + iVar14);
      poVar8 = std::operator<<(poVar8,"\"/><a:ext cx=\"");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,(int)(((local_208 - local_1f8) / (dVar1 - dVar9)) * 360000.0 *
                                      dVar2));
      poVar8 = std::operator<<(poVar8,"\" cy=\"");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,(int)((local_218 / (dVar3 - dVar4)) * 360000.0 * dVar5));
      std::operator<<(poVar8,
                      "\"/></a:xfrm><a:prstGeom prst=\"straightConnector1\"><a:avLst/></a:prstGeom><a:ln><a:tailEnd type=\"triangle\"/></a:ln></p:spPr><p:style><a:lnRef idx=\"1\"><a:schemeClr val=\"accent1\"/></a:lnRef><a:fillRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:fillRef><a:effectRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:effectRef><a:fontRef idx=\"minor\"><a:schemeClr val=\"tx1\"/></a:fontRef></p:style></p:cxnSp>"
                     );
      return;
    }
    if (oVar6 != OBJECT_CLOSEDLINE) {
      return;
    }
  }
  poVar8 = std::operator<<(os,"<p:sp><p:nvSpPr><p:cNvPr id=\"");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,counter);
  std::operator<<(poVar8,
                  "\" name=\"qqqqqqqqq\"><a:extLst><a:ext uri=\"{FF2B5EF4-FFF2-40B4-BE49-F238E27FC236}\"><a16:creationId xmlns:a16=\"http://schemas.microsoft.com/office/drawing/2014/main\" id=\"{29FFCF3D-8F32-482F-B193-ACC1CF50B0FA}\"/></a:ext></a:extLst></p:cNvPr><p:cNvSpPr/><p:nvPr/></p:nvSpPr>"
                 );
  poVar8 = std::operator<<(os,"<p:spPr><a:xfrm><a:off x=\"");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar13);
  poVar8 = std::operator<<(poVar8,"\" y=\"");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar14);
  poVar8 = std::operator<<(poVar8,"\"/>");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(os,"<a:ext cx=\"");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar15);
  poVar8 = std::operator<<(poVar8,"\" cy=\"");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar16);
  poVar8 = std::operator<<(poVar8,"\"/>");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(poVar8,"</a:xfrm><a:custGeom><a:avLst/><a:gdLst>");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  for (canvasPoint.y = 0.0; dVar1 = canvasPoint.y,
      dVar9 = (double)std::vector<_point,_std::allocator<_point>_>::size(&this->points),
      (ulong)dVar1 < (ulong)dVar9; canvasPoint.y = (double)((long)canvasPoint.y + 1)) {
    pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[]
                        (&this->points,(size_type)canvasPoint.y);
    _size::_size((_size *)&index,(double)iVar15,(double)iVar16);
    _local_58 = convertToCanvas(this,pvVar10,(size *)&index);
    poVar8 = std::operator<<(os,"<a:gd name=\"connsiteX");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ulong)canvasPoint.y);
    poVar8 = std::operator<<(poVar8,"\"  fmla=\"*/ ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)(double)local_58);
    poVar8 = std::operator<<(poVar8," w ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar15);
    poVar8 = std::operator<<(poVar8,"\"/>");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(os,"<a:gd name=\"connsiteY");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ulong)canvasPoint.y);
    poVar8 = std::operator<<(poVar8,"\"  fmla=\"*/ ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)canvasPoint.x);
    poVar8 = std::operator<<(poVar8," h ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar16);
    poVar8 = std::operator<<(poVar8,"\"/>");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  if (this->type == OBJECT_CLOSEDLINE) {
    sVar11 = std::vector<_point,_std::allocator<_point>_>::size(&this->points);
    poVar8 = std::operator<<(os,"<a:gd name=\"connsiteX");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar11);
    poVar8 = std::operator<<(poVar8,"\"  fmla=\"*/ ");
    pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,0);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)pvVar10->x);
    poVar8 = std::operator<<(poVar8," w ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar15);
    poVar8 = std::operator<<(poVar8,"\"/>");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(os,"<a:gd name=\"connsiteY");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar11);
    poVar8 = std::operator<<(poVar8,"\"  fmla=\"*/ ");
    pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,0);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)pvVar10->y);
    poVar8 = std::operator<<(poVar8," h ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar16);
    poVar8 = std::operator<<(poVar8,"\"/>");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  poVar8 = std::operator<<(os,"</a:gdLst><a:ahLst/><a:cxnLst>");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  for (index_1 = 0; sVar11 = std::vector<_point,_std::allocator<_point>_>::size(&this->points),
      index_1 < sVar11; index_1 = index_1 + 1) {
    poVar8 = std::operator<<(os,"<a:cxn ang=\"0\">");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(os,"<a:pos x=\"connsiteX");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,index_1);
    poVar8 = std::operator<<(poVar8,"\" y=\"connsiteY");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,index_1);
    poVar8 = std::operator<<(poVar8,"\"/>");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(os,"</a:cxn>");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  if (this->type == OBJECT_CLOSEDLINE) {
    canvasPointStart.y = (double)std::vector<_point,_std::allocator<_point>_>::size(&this->points);
    poVar8 = std::operator<<(os,"<a:cxn ang=\"0\">");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(os,"<a:pos x=\"connsiteX");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ulong)canvasPointStart.y);
    poVar8 = std::operator<<(poVar8,"\" y=\"connsiteY");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ulong)canvasPointStart.y);
    poVar8 = std::operator<<(poVar8,"\"/>");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(os,"</a:cxn>");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,0);
  _size::_size((_size *)&__range3,(double)iVar15,(double)iVar16);
  _local_90 = convertToCanvas(this,pvVar10,(size *)&__range3);
  poVar8 = std::operator<<(os,"</a:cxnLst><a:rect l=\"l\" t=\"t\" r=\"r\" b=\"b\"/><a:pathLst>");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(os,"<a:path w=\"");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar15);
  poVar8 = std::operator<<(poVar8,"\" h=\"");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar16);
  poVar8 = std::operator<<(poVar8,"\">");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(os,"<a:moveTo>");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(os,"<a:pt x=\"");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)(double)local_90);
  poVar8 = std::operator<<(poVar8,"\" y=\"");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)canvasPointStart.x);
  poVar8 = std::operator<<(poVar8,"\"/>");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(os,"</a:moveTo>");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  __end3 = std::vector<bezierPoint,_std::allocator<bezierPoint>_>::begin(&this->curves);
  it = (bezierPoint *)std::vector<bezierPoint,_std::allocator<bezierPoint>_>::end(&this->curves);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<const_bezierPoint_*,_std::vector<bezierPoint,_std::allocator<bezierPoint>_>_>
                                     *)&it), bVar7) {
    pbVar12 = __gnu_cxx::
              __normal_iterator<const_bezierPoint_*,_std::vector<bezierPoint,_std::allocator<bezierPoint>_>_>
              ::operator*(&__end3);
    poVar8 = std::operator<<(os,"<a:cubicBezTo>");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    for (canvasPoint_1.y = 0.0; (ulong)canvasPoint_1.y < 3;
        canvasPoint_1.y = (double)((long)canvasPoint_1.y + 1)) {
      _size::_size((_size *)&canvasPoint_2.y,(double)iVar15,(double)iVar16);
      pVar17 = convertToCanvas(this,pbVar12->pt + (long)canvasPoint_1.y,(size *)&canvasPoint_2.y);
      poVar8 = std::operator<<(os,"<a:pt x=\"");
      local_d8 = pVar17.x;
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)local_d8);
      poVar8 = std::operator<<(poVar8,"\" y=\"");
      canvasPoint_1.x = pVar17.y;
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)canvasPoint_1.x);
      poVar8 = std::operator<<(poVar8,"\"/>");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    poVar8 = std::operator<<(os,"</a:cubicBezTo>");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_bezierPoint_*,_std::vector<bezierPoint,_std::allocator<bezierPoint>_>_>
    ::operator++(&__end3);
  }
  if (this->type == OBJECT_CLOSEDLINE) {
    pvVar10 = std::vector<_point,_std::allocator<_point>_>::operator[](&this->points,0);
    _size::_size((_size *)&minX,(double)iVar15,(double)iVar16);
    _local_f8 = convertToCanvas(this,pvVar10,(size *)&minX);
    poVar8 = std::operator<<(os,"<a:lnTo>");
    poVar8 = std::operator<<(poVar8,"<a:pt x=\"");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)(double)local_f8);
    poVar8 = std::operator<<(poVar8,"\" y=\"");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)canvasPoint_2.x);
    poVar8 = std::operator<<(poVar8,"\"/>");
    poVar8 = std::operator<<(poVar8,"</a:lnTo>");
    poVar8 = std::operator<<(poVar8,"<a:lnTo>");
    poVar8 = std::operator<<(poVar8,"<a:pt x=\"");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)(double)local_f8);
    poVar8 = std::operator<<(poVar8,"\" y=\"");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)canvasPoint_2.x);
    poVar8 = std::operator<<(poVar8,"\"/>");
    poVar8 = std::operator<<(poVar8,"</a:lnTo>");
    std::operator<<(poVar8,"<a:close/>");
    poVar8 = std::operator<<(os,"</a:path>");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(poVar8,"</a:pathLst>");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(poVar8,
                             "</a:custGeom><a:solidFill><a:schemeClr val=\"accent1\"/></a:solidFill></p:spPr>"
                            );
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar8 = std::operator<<(os,"</a:path>");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(poVar8,"</a:pathLst>");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(poVar8,"</a:custGeom><a:noFill/></p:spPr>");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<(os,
                  "<p:style><a:lnRef idx=\"2\"><a:schemeClr val=\"accent1\"><a:shade val=\"50000\"/></a:schemeClr></a:lnRef><a:fillRef idx=\"1\"><a:schemeClr val=\"accent1\"/></a:fillRef><a:effectRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:effectRef><a:fontRef idx=\"minor\"><a:schemeClr val=\"lt1\"/></a:fontRef></p:style><p:txBody><a:bodyPr rtlCol=\"0\" anchor=\"ctr\"/><a:lstStyle/><a:p><a:pPr algn=\"ctr\"/><a:endParaRPr kumimoji=\"1\" lang=\"ja-JP\" altLang=\"en-US\"/></a:p></p:txBody></p:sp>"
                 );
  return;
}

Assistant:

void drawObject(std::ostream& os, unsigned int counter, const size& _canvasOffset, const size& _canvasSize) const
    {
        int canvasOffsetPPTXWidth = (int)(_canvasOffset.width * cm2pptx);
        int canvasOffsetPPTXHeight = (int)(_canvasOffset.height * cm2pptx);
        int canvasSizePPTXWidth = (int)(_canvasSize.width * cm2pptx);
        int canvasSizePPTXHeight = (int)(_canvasSize.height * cm2pptx);
        switch (type)
        {
        case OBJECT_CLOSEDLINE:
        case OBJECT_CURVES:
        {
            os << "<p:sp><p:nvSpPr><p:cNvPr id=\"" << counter << "\" name=\"qqqqqqqqq\"><a:extLst><a:ext uri=\"{FF2B5EF4-FFF2-40B4-BE49-F238E27FC236}\"><a16:creationId xmlns:a16=\"http://schemas.microsoft.com/office/drawing/2014/main\" id=\"{29FFCF3D-8F32-482F-B193-ACC1CF50B0FA}\"/></a:ext></a:extLst></p:cNvPr><p:cNvSpPr/><p:nvPr/></p:nvSpPr>";
            os << "<p:spPr><a:xfrm><a:off x=\"" << canvasOffsetPPTXWidth << "\" y=\"" << canvasOffsetPPTXHeight << "\"/>" << std::endl;
            os << "<a:ext cx=\"" << canvasSizePPTXWidth << "\" cy=\"" << canvasSizePPTXHeight << "\"/>" << std::endl << "</a:xfrm><a:custGeom><a:avLst/><a:gdLst>" << std::endl;
            for (size_t i = 0; i < points.size(); i++)
            {
                point canvasPoint = convertToCanvas(points[i], size(canvasSizePPTXWidth, canvasSizePPTXHeight));
                os << "<a:gd name=\"connsiteX" << i << "\"  fmla=\"*/ " << (int)(canvasPoint.x) << " w " << canvasSizePPTXWidth << "\"/>" << std::endl;
                os << "<a:gd name=\"connsiteY" << i << "\"  fmla=\"*/ " << (int)(canvasPoint.y) << " h " << canvasSizePPTXHeight << "\"/>" << std::endl;
            }
            if (type == OBJECT_CLOSEDLINE)
            {
                size_t index = points.size();
                os << "<a:gd name=\"connsiteX" << index << "\"  fmla=\"*/ " << (int)(points[0].x) << " w " << canvasSizePPTXWidth << "\"/>" << std::endl;
                os << "<a:gd name=\"connsiteY" << index << "\"  fmla=\"*/ " << (int)(points[0].y) << " h " << canvasSizePPTXHeight << "\"/>" << std::endl;
            }
            os << "</a:gdLst><a:ahLst/><a:cxnLst>" << std::endl;
            for (size_t i = 0; i < points.size(); i++)
            {
                os << "<a:cxn ang=\"0\">" << std::endl;
                os << "<a:pos x=\"connsiteX" << i << "\" y=\"connsiteY" << i << "\"/>" << std::endl;
                os << "</a:cxn>" << std::endl;
            }
            if (type == OBJECT_CLOSEDLINE)
            {
                size_t index = points.size();
                os << "<a:cxn ang=\"0\">" << std::endl;
                os << "<a:pos x=\"connsiteX" << index << "\" y=\"connsiteY" << index << "\"/>" << std::endl;
                os << "</a:cxn>" << std::endl;
            }
            {
                point canvasPointStart = convertToCanvas(points[0], size(canvasSizePPTXWidth, canvasSizePPTXHeight));
                os << "</a:cxnLst><a:rect l=\"l\" t=\"t\" r=\"r\" b=\"b\"/><a:pathLst>" << std::endl;
                os << "<a:path w=\"" << canvasSizePPTXWidth << "\" h=\"" << canvasSizePPTXHeight << "\">" << std::endl;
                os << "<a:moveTo>" << std::endl;
                os << "<a:pt x=\"" << (int)(canvasPointStart.x) << "\" y=\"" << (int)(canvasPointStart.y) << "\"/>" << std::endl;
                os << "</a:moveTo>" << std::endl;
            }
            for (auto&& it : curves)
            {
                os << "<a:cubicBezTo>" << std::endl;
                for (size_t i = 0; i < 3; i++)
                {
                    point canvasPoint = convertToCanvas(it.pt[i], size(canvasSizePPTXWidth, canvasSizePPTXHeight));
                    os << "<a:pt x=\"" << (int)(canvasPoint.x) << "\" y=\"" << (int)(canvasPoint.y) << "\"/>" << std::endl;
                }
                os << "</a:cubicBezTo>" << std::endl;
            }
            if (type == OBJECT_CLOSEDLINE)
            {
                point canvasPoint = convertToCanvas(points[0], size(canvasSizePPTXWidth, canvasSizePPTXHeight));
                os << "<a:lnTo>"
                    << "<a:pt x=\"" << (int)(canvasPoint.x) << "\" y=\"" << (int)(canvasPoint.y) << "\"/>"
                    << "</a:lnTo>"
                    << "<a:lnTo>"
                    << "<a:pt x=\"" << (int)(canvasPoint.x) << "\" y=\"" << (int)(canvasPoint.y) << "\"/>"
                    << "</a:lnTo>"
                    << "<a:close/>";
                os << "</a:path>" << std::endl << "</a:pathLst>" << std::endl << "</a:custGeom><a:solidFill><a:schemeClr val=\"accent1\"/></a:solidFill></p:spPr>" << std::endl;

            }
            else
            {
                os << "</a:path>" << std::endl << "</a:pathLst>" << std::endl << "</a:custGeom><a:noFill/></p:spPr>" << std::endl;
            }
            os << "<p:style><a:lnRef idx=\"2\"><a:schemeClr val=\"accent1\"><a:shade val=\"50000\"/></a:schemeClr></a:lnRef><a:fillRef idx=\"1\"><a:schemeClr val=\"accent1\"/></a:fillRef><a:effectRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:effectRef><a:fontRef idx=\"minor\"><a:schemeClr val=\"lt1\"/></a:fontRef></p:style><p:txBody><a:bodyPr rtlCol=\"0\" anchor=\"ctr\"/><a:lstStyle/><a:p><a:pPr algn=\"ctr\"/><a:endParaRPr kumimoji=\"1\" lang=\"ja-JP\" altLang=\"en-US\"/></a:p></p:txBody></p:sp>";
        }
        break;
        case OBJECT_STRAIGHTLINE:
        {
            double minX = points[0].x < points[1].x ? points[0].x : points[1].x;
            double maxX = points[1].x < points[0].x ? points[0].x : points[1].x;
            double minY = points[0].y < points[1].y ? points[0].y : points[1].y;
            double maxY = points[1].y < points[0].y ? points[0].y : points[1].y;
            point LB = convertToCanvas(point(minX, minY), size(canvasSizePPTXWidth, canvasSizePPTXHeight));
            point RT = convertToCanvas(point(maxX, maxY), size(canvasSizePPTXWidth, canvasSizePPTXHeight));
            int offsetX = (int)(LB.x) + canvasOffsetPPTXWidth;
            int offsetY = (int)(RT.y) + canvasOffsetPPTXHeight;
            int canvasWidth = (int)(((maxX - minX) / (rangeX.max - rangeX.min)) * cm2pptx * _canvasSize.width);
            int canvasHeight = (int)(((maxY - minY) / (rangeY.max - rangeY.min)) * cm2pptx * _canvasSize.height);

            os << "<p:cxnSp><p:nvCxnSpPr><p:cNvPr id=\"" << counter << "\" name=\"LineArrow" << counter << "\"><a:extLst><a:ext uri=\"{FF2B5EF4-FFF2-40B4-BE49-F238E27FC236}\"><a16:creationId xmlns:a16=\"http://schemas.microsoft.com/office/drawing/2014/main\" id=\"{B606E735-2B9E-47D5-A972-698E782DD359}\"/></a:ext></a:extLst></p:cNvPr><p:cNvCxnSpPr/><p:nvPr/></p:nvCxnSpPr>";
            os << "<p:spPr><a:xfrm flipV=\"1\"><a:off x=\"" << offsetX << "\" y=\"" << offsetY << "\"/><a:ext cx=\"" << canvasWidth << "\" cy=\"" << canvasHeight << "\"/></a:xfrm><a:prstGeom prst=\"straightConnector1\"><a:avLst/></a:prstGeom><a:ln><a:tailEnd type=\"triangle\"/></a:ln></p:spPr><p:style><a:lnRef idx=\"1\"><a:schemeClr val=\"accent1\"/></a:lnRef><a:fillRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:fillRef><a:effectRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:effectRef><a:fontRef idx=\"minor\"><a:schemeClr val=\"tx1\"/></a:fontRef></p:style></p:cxnSp>";
        }
        break;
        default:
            break;
        }
    }